

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenThread.cpp
# Opt level: O3

void __thiscall
brynet::net::ListenThread::startListen
          (ListenThread *this,bool isIPV6,string *ip,int port,ACCEPT_CALLBACK *callback)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  sock fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  runtime_error *prVar6;
  int *piVar7;
  thread *__tmp_1;
  shared_ptr<brynet::net::ListenSocket> listenSocket;
  undefined1 local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  _Any_data local_70;
  code *local_60;
  long lStack_58;
  pthread_mutex_t *local_50;
  long *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_50 = (pthread_mutex_t *)&this->mListenThreadGuard;
  iVar3 = pthread_mutex_lock(local_50);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if ((this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) goto LAB_0012bac5;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"accept callback is nullptr");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fd = base::Listen(isIPV6,(ip->_M_dataplus)._M_p,port,0x200);
  if (fd == -1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar7 = __errno_location();
    std::runtime_error::runtime_error(prVar6,"listen error of:" + *piVar7);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->mIsIPV6 = isIPV6;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147cf0;
  *(undefined1 *)&p_Var4[1]._vptr__Sp_counted_base = 1;
  (this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var4 + 1);
  p_Var1 = (this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::__cxx11::string::_M_assign((string *)&this->mIP);
  this->mPort = port;
  ListenSocket::Create((ListenSocket *)local_90,fd);
  std::__shared_ptr<brynet::net::ListenSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<brynet::net::ListenSocket,brynet::net::ListenSocket::ListenSocketDeleter,void>
            ((__shared_ptr<brynet::net::ListenSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<brynet::net::ListenSocket,_brynet::net::ListenSocket::ListenSocketDeleter>
              *)local_90);
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_90 + 8))();
  }
  local_90 = (undefined1  [8])
             (this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_88 = p_Var1;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        goto LAB_0012b950;
      }
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
  }
LAB_0012b950:
  local_80 = local_40;
  p_Stack_78 = local_38;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  std::
  function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
  ::function((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
              *)&local_70,callback);
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147d90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48 = (long *)operator_new(0x48);
  p_Var2 = p_Stack_78;
  p_Var4 = local_88;
  *local_48 = (long)&PTR___State_impl_001481d8;
  ((tuple<brynet::net::ListenSocket_*,_brynet::net::ListenSocket::ListenSocketDeleter> *)
  (local_48 + 1))->
  super__Tuple_impl<0UL,_brynet::net::ListenSocket_*,_brynet::net::ListenSocket::ListenSocketDeleter>
       = (_Tuple_impl<0UL,_brynet::net::ListenSocket_*,_brynet::net::ListenSocket::ListenSocketDeleter>
          )local_90;
  local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48[2] = (long)p_Var4;
  local_90 = (undefined1  [8])0x0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48[3] = local_80;
  local_48[4] = (long)p_Var2;
  local_80 = 0;
  local_48[7] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[8] = lStack_58;
  if (local_60 != (code *)0x0) {
    local_48[5] = (long)local_70._M_unused._0_8_;
    local_48[6] = local_70._8_8_;
    local_48[7] = (long)local_60;
    local_60 = (code *)0x0;
    lStack_58 = 0;
  }
  std::thread::_M_start_thread(p_Var5 + 1,&local_48,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  (this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  p_Var4 = (this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
LAB_0012bac5:
  pthread_mutex_unlock(local_50);
  return;
}

Assistant:

void ListenThread::startListen(bool isIPV6, 
    const std::string& ip,
    int port,
    ACCEPT_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mListenThreadGuard);

    if (mListenThread != nullptr)
    {
        return;
    }
    if (callback == nullptr)
    {
        throw std::runtime_error("accept callback is nullptr");
    }

    sock fd = brynet::net::base::Listen(isIPV6, ip.c_str(), port, 512);
    if (fd == SOCKET_ERROR)
    {
        throw std::runtime_error("listen error of:" + sErrno);
    }

    mIsIPV6 = isIPV6;
    mRunListen = std::make_shared<bool>(true);
    mIP = ip;
    mPort = port;

    auto listenSocket = std::shared_ptr<ListenSocket>(ListenSocket::Create(fd));
    auto isRunListen = mRunListen;

    mListenThread = std::make_shared<std::thread>([isRunListen, listenSocket, callback]() mutable {
        while (*isRunListen)
        {
            auto clientSocket = runOnceListen(listenSocket);
            if (clientSocket == nullptr)
            {
                continue;
            }

            if (*isRunListen)
            {
                callback(std::move(clientSocket));
            }
        }
    });
}